

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

CURLcode Curl_transferencode(Curl_easy *data)

{
  char *pcVar1;
  bool bVar2;
  char *local_28;
  char *local_20;
  char *cptr;
  Curl_easy *data_local;
  
  pcVar1 = Curl_checkheaders(data,"TE",2);
  if ((pcVar1 == (char *)0x0) && ((*(ulong *)&(data->set).field_0x8ba >> 0x16 & 1) != 0)) {
    local_20 = Curl_checkheaders(data,"Connection",10);
    (*Curl_cfree)((data->state).aptr.te);
    (data->state).aptr.te = (char *)0x0;
    if ((local_20 != (char *)0x0) &&
       (local_20 = Curl_copy_header_value(local_20), local_20 == (char *)0x0)) {
      return CURLE_OUT_OF_MEMORY;
    }
    if (local_20 == (char *)0x0) {
      local_28 = "";
    }
    else {
      local_28 = local_20;
    }
    bVar2 = false;
    if (local_20 != (char *)0x0) {
      bVar2 = *local_20 != '\0';
    }
    pcVar1 = "";
    if (bVar2) {
      pcVar1 = ", ";
    }
    pcVar1 = curl_maprintf("Connection: %s%sTE\r\nTE: gzip\r\n",local_28,pcVar1);
    (data->state).aptr.te = pcVar1;
    (*Curl_cfree)(local_20);
    if ((data->state).aptr.te == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
  }
  return CURLE_OK;
}

Assistant:

CURLcode Curl_transferencode(struct Curl_easy *data)
{
  if(!Curl_checkheaders(data, STRCONST("TE")) &&
     data->set.http_transfer_encoding) {
    /* When we are to insert a TE: header in the request, we must also insert
       TE in a Connection: header, so we need to merge the custom provided
       Connection: header and prevent the original to get sent. Note that if
       the user has inserted his/her own TE: header we don't do this magic
       but then assume that the user will handle it all! */
    char *cptr = Curl_checkheaders(data, STRCONST("Connection"));
#define TE_HEADER "TE: gzip\r\n"

    Curl_safefree(data->state.aptr.te);

    if(cptr) {
      cptr = Curl_copy_header_value(cptr);
      if(!cptr)
        return CURLE_OUT_OF_MEMORY;
    }

    /* Create the (updated) Connection: header */
    data->state.aptr.te = aprintf("Connection: %s%sTE\r\n" TE_HEADER,
                                cptr ? cptr : "", (cptr && *cptr) ? ", ":"");

    free(cptr);
    if(!data->state.aptr.te)
      return CURLE_OUT_OF_MEMORY;
  }
  return CURLE_OK;
}